

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O3

void Ptex::v2_4::(anonymous_namespace)::Apply<float,1>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int param_5)

{
  float *pfVar1;
  float fVar2;
  byte bVar3;
  int iVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  long lVar8;
  float fVar9;
  
  bVar3 = (k->res).ulog2;
  if (k->vw << (bVar3 & 0x1f) != 0) {
    pfVar6 = (float *)((long)data + ((long)(k->v << (bVar3 & 0x1f)) + (long)k->u) * 4);
    pfVar1 = pfVar6 + (k->vw << (bVar3 & 0x1f));
    pfVar5 = k->ku;
    pfVar7 = k->kv;
    iVar4 = k->uw;
    do {
      fVar9 = *pfVar5 * *pfVar6;
      if (iVar4 != 1) {
        lVar8 = 0;
        do {
          fVar9 = fVar9 + *(float *)((long)pfVar6 + lVar8 + 4) *
                          *(float *)((long)pfVar5 + lVar8 + 4);
          lVar8 = lVar8 + 4;
        } while ((long)iVar4 * 4 + -4 != lVar8);
        pfVar6 = (float *)((long)pfVar6 + lVar8);
      }
      fVar2 = *pfVar7;
      pfVar7 = pfVar7 + 1;
      *result = fVar9 * fVar2 + *result;
      pfVar6 = pfVar6 + (long)((1 << (bVar3 & 0x1f)) - iVar4) + 1;
    } while (pfVar6 != pfVar1);
  }
  return;
}

Assistant:

int u() const { return 1<<(unsigned)ulog2; }